

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexOrdering.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderVertexOrdering::verifyVertexOrderingCorrectness
          (TessellationShaderVertexOrdering *this,_test_iteration *test_iteration)

{
  ostringstream *poVar1;
  char *pcVar2;
  _tessellation_shader_vertex_ordering _Var3;
  char *pcVar4;
  MessageBuilder *pMVar5;
  TestError *this_00;
  ulong uVar6;
  _tessellation_shader_vertex_ordering vertex_ordering_00;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  long lVar7;
  ulong uVar8;
  float *out_cartesian_coordinates;
  float fVar9;
  float cartesian_vertex_data [6];
  string vertex_ordering;
  string primitive_mode;
  float barycentric_vertex_data [9];
  undefined8 uStack_230;
  float local_228 [6];
  TessellationShaderVertexOrdering *local_210;
  pointer local_208;
  pointer local_200;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [8];
  undefined4 local_1b0;
  undefined4 local_1ac;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 local_198;
  ios_base local_140 [272];
  
  local_210 = this;
  if (2 < test_iteration->n_vertices) {
    uVar8 = 0;
    do {
      pcVar4 = test_iteration->data;
      uVar6 = (ulong)(uint)((int)uVar8 * 9);
      local_228[0] = *(float *)(pcVar4 + uVar6 * 4);
      local_228[1] = (float)*(undefined4 *)(pcVar4 + uVar6 * 4 + 4);
      local_228[2] = (float)*(undefined4 *)(pcVar4 + uVar6 * 4 + 0xc);
      local_228[3] = (float)*(undefined4 *)(pcVar4 + uVar6 * 4 + 0x10);
      local_228[4] = (float)*(undefined4 *)(pcVar4 + uVar6 * 4 + 0x18);
      local_228[5] = (float)*(undefined4 *)(pcVar4 + uVar6 * 4 + 0x1c);
      if (test_iteration->primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) {
        local_1b8._4_4_ = *(undefined4 *)(pcVar4 + uVar6 * 4 + 4);
        local_1b8._0_4_ = *(undefined4 *)(pcVar4 + uVar6 * 4);
        local_1b0 = *(undefined4 *)(pcVar4 + uVar6 * 4 + 8);
        local_1ac = *(undefined4 *)(pcVar4 + uVar6 * 4 + 0xc);
        pcVar2 = pcVar4 + uVar6 * 4 + 0x10;
        local_1a8._0_1_ = pcVar2[0];
        local_1a8._1_1_ = pcVar2[1];
        local_1a8._2_1_ = pcVar2[2];
        local_1a8._3_1_ = pcVar2[3];
        pcVar2 = pcVar4 + uVar6 * 4 + 0x14;
        local_1a4._0_1_ = pcVar2[0];
        local_1a4._1_1_ = pcVar2[1];
        local_1a4._2_1_ = pcVar2[2];
        local_1a4._3_1_ = pcVar2[3];
        pcVar2 = pcVar4 + uVar6 * 4 + 0x18;
        local_1a0._0_1_ = pcVar2[0];
        local_1a0._1_1_ = pcVar2[1];
        local_1a0._2_1_ = pcVar2[2];
        local_1a0._3_1_ = pcVar2[3];
        pcVar2 = pcVar4 + uVar6 * 4 + 0x1c;
        local_19c._0_1_ = pcVar2[0];
        local_19c._1_1_ = pcVar2[1];
        local_19c._2_1_ = pcVar2[2];
        local_19c._3_1_ = pcVar2[3];
        pcVar4 = pcVar4 + uVar6 * 4 + 0x20;
        local_198._0_1_ = pcVar4[0];
        local_198._1_1_ = pcVar4[1];
        local_198._2_1_ = pcVar4[2];
        local_198._3_1_ = pcVar4[3];
        lVar7 = 0;
        out_cartesian_coordinates = local_228;
        do {
          uStack_230 = (undefined1 *)0xcc6c22;
          TessellationShaderUtils::convertBarycentricCoordinatesToCartesian
                    ((float *)(local_1b8 + lVar7),out_cartesian_coordinates);
          out_cartesian_coordinates = out_cartesian_coordinates + 2;
          lVar7 = lVar7 + 0xc;
          in_RDX = extraout_RDX;
        } while (lVar7 != 0x24);
      }
      fVar9 = 0.0;
      lVar7 = 1;
      do {
        uVar6 = (ulong)((int)lVar7 + 1);
        if (lVar7 == 5) {
          uVar6 = 0;
        }
        fVar9 = fVar9 + (*(float *)((long)&uStack_230 + lVar7 * 4 + 4) * local_228[uVar6 + 1] -
                        local_228[lVar7] * local_228[uVar6]);
        lVar7 = lVar7 + 2;
      } while (lVar7 != 7);
      fVar9 = fVar9 * 0.5;
      _Var3 = test_iteration->vertex_ordering;
      if (_Var3 == TESSELLATION_SHADER_VERTEX_ORDERING_CCW) {
        if (fVar9 < 0.0) goto LAB_00cc6cc5;
      }
      else if (((_Var3 == TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT) && (fVar9 < 0.0)) ||
              ((_Var3 == TESSELLATION_SHADER_VERTEX_ORDERING_CW && (0.0 <= fVar9)))) {
LAB_00cc6cc5:
        uStack_230 = (undefined1 *)0xcc6cd2;
        TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
                  (&local_1d8,(TessellationShaderUtils *)(ulong)test_iteration->primitive_mode,
                   (_tessellation_primitive_mode)in_RDX);
        uStack_230 = (undefined1 *)0xcc6cdf;
        TessellationShaderUtils::getESTokenForVertexOrderingMode_abi_cxx11_
                  (&local_1f8,(TessellationShaderUtils *)(ulong)test_iteration->vertex_ordering,
                   vertex_ordering_00);
        local_1b8 = (undefined1  [8])
                    ((local_210->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log
        ;
        uStack_230 = (undefined1 *)0xcc6cfd;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        uStack_230 = (undefined1 *)0xcc6d11;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"For primitive mode: [",0x15);
        local_200 = local_1d8._M_dataplus._M_p;
        uStack_230 = (undefined1 *)0xcc6d28;
        pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b8,&local_200);
        poVar1 = &pMVar5->m_str;
        uStack_230 = (undefined1 *)0xcc6d43;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                   "] and inner tessellation levels: [",0x22);
        uStack_230 = (undefined1 *)0xcc6d53;
        std::ostream::_M_insert<double>((double)test_iteration->inner_tess_levels[0]);
        uStack_230 = (undefined1 *)0xcc6d67;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
        uStack_230 = (undefined1 *)0xcc6d77;
        std::ostream::_M_insert<double>((double)test_iteration->inner_tess_levels[1]);
        uStack_230 = (undefined1 *)0xcc6d8b;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                   "] and outer tessellation levels: [",0x22);
        uStack_230 = (undefined1 *)0xcc6d9b;
        std::ostream::_M_insert<double>((double)test_iteration->outer_tess_levels[0]);
        uStack_230 = (undefined1 *)0xcc6daf;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
        uStack_230 = (undefined1 *)0xcc6dbf;
        std::ostream::_M_insert<double>((double)test_iteration->outer_tess_levels[1]);
        uStack_230 = (undefined1 *)0xcc6dd3;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
        uStack_230 = (undefined1 *)0xcc6de3;
        std::ostream::_M_insert<double>((double)test_iteration->outer_tess_levels[2]);
        uStack_230 = (undefined1 *)0xcc6df7;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
        uStack_230 = (undefined1 *)0xcc6e07;
        std::ostream::_M_insert<double>((double)test_iteration->outer_tess_levels[3]);
        uStack_230 = (undefined1 *)0xcc6e1b;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"] ",2);
        uStack_230 = (undefined1 *)0xcc6e2f;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                   "and vertex ordering: [",0x16);
        local_208 = local_1f8._M_dataplus._M_p;
        uStack_230 = (undefined1 *)0xcc6e44;
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_208);
        uStack_230 = (undefined1 *)0xcc6e5c;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                   "] , vertex orientation has been found to be incompatible with the ordering requested."
                   ,0x55);
        uStack_230 = (undefined1 *)0xcc6e6b;
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        uStack_230 = (undefined1 *)0xcc6e7a;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
        uStack_230 = (undefined1 *)0xcc6e87;
        std::ios_base::~ios_base(local_140);
        if ((test_iteration->vertex_ordering & ~TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT) ==
            TESSELLATION_SHADER_VERTEX_ORDERING_CCW) {
          uStack_230 = (undefined1 *)0xcc6e9a;
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          uStack_230 = (undefined1 *)0xcc6ebb;
          tcu::TestError::TestError
                    (this_00,
                     "Counter-clockwise ordering was expected but retrieved tessellation coordinates are laid out in clockwise order"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexOrdering.cpp"
                     ,0x28e);
        }
        else {
          uStack_230 = (undefined1 *)0xcc6ec7;
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          uStack_230 = (undefined1 *)0xcc6ee8;
          tcu::TestError::TestError
                    (this_00,
                     "Clockwise ordering was expected but retrieved tessellation coordinates are laid out in counter-clockwise order"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexOrdering.cpp"
                     ,0x293);
        }
        uStack_230 = &LAB_00cc6efe;
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)test_iteration->n_vertices / 3);
  }
  return;
}

Assistant:

void TessellationShaderVertexOrdering::verifyVertexOrderingCorrectness(const _test_iteration& test_iteration)
{
	/* Sanity check */
	DE_ASSERT(test_iteration.primitive_mode != TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES);

	/* Iterate through all vertices */
	const float		   epsilon					= 1e-5f;
	const unsigned int n_vertices_per_primitive = 3;

	for (unsigned int n_primitive = 0; n_primitive < test_iteration.n_vertices / n_vertices_per_primitive;
		 ++n_primitive)
	{
		const float* primitive_data =
			(const float*)test_iteration.data + 3 /* components */ * n_primitive * n_vertices_per_primitive;
		const float* primitive_vertex1_data = primitive_data;
		const float* primitive_vertex2_data = primitive_vertex1_data + 3; /* components */
		const float* primitive_vertex3_data = primitive_vertex2_data + 3; /* components */

		float cartesian_vertex_data[6] = { primitive_vertex1_data[0], primitive_vertex1_data[1],
										   primitive_vertex2_data[0], primitive_vertex2_data[1],
										   primitive_vertex3_data[0], primitive_vertex3_data[1] };

		if (test_iteration.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES)
		{
			/* Triangles are described in barycentric coordinate. Convert to
			 * cartesian coordinates before we continue with actual test.
			 */
			const float barycentric_vertex_data[] = {
				primitive_vertex1_data[0], primitive_vertex1_data[1], primitive_vertex1_data[2],
				primitive_vertex2_data[0], primitive_vertex2_data[1], primitive_vertex2_data[2],
				primitive_vertex3_data[0], primitive_vertex3_data[1], primitive_vertex3_data[2],
			};

			/* Sanity checks .. */
			DE_UNREF(epsilon);
			DE_ASSERT(de::abs(barycentric_vertex_data[0] + barycentric_vertex_data[1] + barycentric_vertex_data[2] -
							  1.0f) < epsilon);
			DE_ASSERT(de::abs(barycentric_vertex_data[3] + barycentric_vertex_data[4] + barycentric_vertex_data[5] -
							  1.0f) < epsilon);
			DE_ASSERT(de::abs(barycentric_vertex_data[6] + barycentric_vertex_data[7] + barycentric_vertex_data[8] -
							  1.0f) < epsilon);

			for (unsigned int n_vertex = 0; n_vertex < 3; ++n_vertex)
			{
				TessellationShaderUtils::convertBarycentricCoordinatesToCartesian(
					barycentric_vertex_data + n_vertex * 3, cartesian_vertex_data + n_vertex * 2);
			}
		} /* if (test_iteration.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) */

		/* Compute result of eq 3.6.1 */
		float determinant = 0.0f;

		for (unsigned int n_vertex = 0; n_vertex < n_vertices_per_primitive; ++n_vertex)
		{
			int i_op_1 = (n_vertex + 1) % n_vertices_per_primitive;

			determinant += (cartesian_vertex_data[n_vertex * 2 /* components */ + 0] *
								cartesian_vertex_data[i_op_1 * 2 /* components */ + 1] -
							cartesian_vertex_data[i_op_1 * 2 /* components */ + 0] *
								cartesian_vertex_data[n_vertex * 2 /* components */ + 1]);
		} /* for (all vertices) */

		determinant *= 0.5f;

		/* Positive determinant implies counterclockwise ordering */
		if (((test_iteration.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_CCW ||
			  test_iteration.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT) &&
			 determinant < 0.0f) ||
			(test_iteration.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_CW && determinant >= 0.0f))
		{
			std::string primitive_mode =
				TessellationShaderUtils::getESTokenForPrimitiveMode(test_iteration.primitive_mode);
			std::string vertex_ordering =
				TessellationShaderUtils::getESTokenForVertexOrderingMode(test_iteration.vertex_ordering);

			m_testCtx.getLog() << tcu::TestLog::Message << "For primitive mode: [" << primitive_mode.c_str()
							   << "] "
								  "and inner tessellation levels:"
								  " ["
							   << test_iteration.inner_tess_levels[0] << ", " << test_iteration.inner_tess_levels[1]
							   << "] "
								  "and outer tessellation levels:"
								  " ["
							   << test_iteration.outer_tess_levels[0] << ", " << test_iteration.outer_tess_levels[1]
							   << ", " << test_iteration.outer_tess_levels[2] << ", "
							   << test_iteration.outer_tess_levels[3] << "] "
							   << "and vertex ordering: [" << vertex_ordering.c_str()
							   << "] "
								  ", vertex orientation has been found to be incompatible with the ordering requested."
							   << tcu::TestLog::EndMessage;

			if (test_iteration.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_CCW ||
				test_iteration.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT)
			{
				TCU_FAIL("Counter-clockwise ordering was expected but retrieved tessellation coordinates are laid out "
						 "in clockwise order");
			}
			else
			{
				TCU_FAIL("Clockwise ordering was expected but retrieved tessellation coordinates are laid out in "
						 "counter-clockwise order");
			}
		}
	} /* for (all triangles) */
}